

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

bool __thiscall
mpt::typed_array<mpt::reference<mpt::cycle>_>::insert
          (typed_array<mpt::reference<mpt::cycle>_> *this,long pos,reference<mpt::cycle> *val)

{
  content<mpt::reference<mpt::cycle>_> *pcVar1;
  bool bVar2;
  long *plVar3;
  long lVar4;
  cycle *pcVar5;
  ulong uVar6;
  
  pcVar1 = (this->super_unique_array<mpt::reference<mpt::cycle>_>)._ref._ref;
  if (pcVar1 == (content<mpt::reference<mpt::cycle>_> *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (pcVar1->super_buffer)._used >> 3;
  }
  if (pos < 0) {
    pos = pos + uVar6;
    if (pos < 0) {
      return false;
    }
  }
  else if ((long)uVar6 <= pos) {
    uVar6 = pos;
  }
  bVar2 = unique_array<mpt::reference<mpt::cycle>_>::reserve
                    (&this->super_unique_array<mpt::reference<mpt::cycle>_>,uVar6 + 1);
  if (!bVar2) {
    return false;
  }
  plVar3 = (long *)mpt::buffer::insert((ulong)(this->super_unique_array<mpt::reference<mpt::cycle>_>
                                              )._ref._ref,pos << 3);
  if (plVar3 == (long *)0x0) {
    return plVar3 != (long *)0x0;
  }
  *plVar3 = 0;
  pcVar5 = val->_ref;
  if (pcVar5 != (cycle *)0x0) {
    lVar4 = (**(code **)(*(long *)pcVar5 + 0x10))(pcVar5);
    if (lVar4 == 0) {
      pcVar5 = (cycle *)0x0;
    }
    if ((long *)*plVar3 != (long *)0x0) {
      (**(code **)(*(long *)*plVar3 + 8))();
    }
    *plVar3 = (long)pcVar5;
    return true;
  }
  return true;
}

Assistant:

bool insert(long pos, const T &val)
	{
		long len = this->length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!this->reserve(len + 1)) {
			return 0;
		}
		void *d = this->_ref.instance()->insert(pos);
		if (d) {
			new (d) T(val);
			return true;
		}
		return false;
	}